

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_manager.h
# Opt level: O0

bool __thiscall
spvtools::opt::analysis::CompareTypePointers::operator()
          (CompareTypePointers *this,Type *lhs,Type *rhs)

{
  bool bVar1;
  Type *rhs_local;
  Type *lhs_local;
  CompareTypePointers *this_local;
  
  if (lhs == (Type *)0x0 || rhs == (Type *)0x0) {
    __assert_fail("lhs && rhs",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/type_manager.h"
                  ,0x3a,
                  "bool spvtools::opt::analysis::CompareTypePointers::operator()(const Type *, const Type *) const"
                 );
  }
  bVar1 = analysis::Type::IsSame(lhs,rhs);
  return bVar1;
}

Assistant:

bool operator()(const Type* lhs, const Type* rhs) const {
    assert(lhs && rhs);
    return lhs->IsSame(rhs);
  }